

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

bool __thiscall cmCTestRunTest::StartTest(cmCTestRunTest *this,size_t completed,size_t total)

{
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  _Setw _Var4;
  ostream *poVar5;
  char *pcVar6;
  size_type sVar7;
  reference pvVar8;
  string *str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  reference filename;
  ulong uVar9;
  bool local_d29;
  duration<double,_std::ratio<1L,_1L>_> local_c28;
  rep_conflict local_c20;
  duration<double,_std::ratio<1L,_1L>_> local_c18;
  int local_c0c;
  duration<long,_std::ratio<3600L,_1L>_> local_c08;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_c00;
  duration<long,_std::ratio<1L,_1000000000L>_> local_bf8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_bf0;
  duration<double,_std::ratio<1L,_1L>_> local_be8;
  duration<double,_std::ratio<1L,_1L>_> stop_timeout;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_bd8;
  time_point stop_time;
  cmDuration timeout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba8;
  string local_b88 [32];
  ostringstream local_b68 [8];
  ostringstream cmCTestLog_msg_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0;
  string local_9d0 [32];
  ostringstream local_9b0 [8];
  ostringstream cmCTestLog_msg_4;
  string *file;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_7f8 [8];
  ostringstream cmCTestLog_msg_3;
  cmAlphaNum local_680;
  cmAlphaNum local_650;
  string local_620;
  string local_600 [8];
  string msg_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args;
  undefined1 local_5b8 [8];
  ostringstream cmCTestLog_msg_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  reference local_420;
  string *failedDep;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_3f8 [8];
  string msg;
  string local_3d0 [32];
  undefined1 local_3b0 [8];
  ostringstream cmCTestLog_msg_1;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 local_1f8 [8];
  string testName;
  undefined1 local_1a0 [8];
  ostringstream cmCTestLog_msg;
  size_t total_local;
  size_t completed_local;
  cmCTestRunTest *this_local;
  
  this->TotalNumberOfTests = total;
  bVar2 = cmCTest::GetTestProgressOutput(this->CTest);
  if (bVar2) {
    GetTestPrefix_abi_cxx11_(&local_238,this,completed,total);
    std::operator+(&local_218,&local_238,&this->TestProperties->Name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                   &local_218,"\n");
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    std::operator<<((ostream *)local_3b0,(string *)local_1f8);
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x20f,pcVar6,false);
    std::__cxx11::string::~string(local_3d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
    std::__cxx11::string::~string((string *)local_1f8);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    iVar3 = getNumWidth(total);
    _Var4 = std::setw(iVar3 * 2 + 8);
    poVar5 = std::operator<<((ostream *)local_1a0,_Var4);
    poVar5 = std::operator<<(poVar5,"Start ");
    iVar3 = cmCTestTestHandler::GetMaxIndex(this->TestHandler);
    iVar3 = getNumWidth((long)iVar3);
    _Var4 = std::setw(iVar3);
    poVar5 = std::operator<<(poVar5,_Var4);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->TestProperties->Index);
    poVar5 = std::operator<<(poVar5,": ");
    poVar5 = std::operator<<(poVar5,(string *)this->TestProperties);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x20b,pcVar6,false);
    std::__cxx11::string::~string((string *)(testName.field_2._M_local_buf + 8));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  }
  std::__cxx11::string::clear();
  (this->TestResult).Properties = this->TestProperties;
  msg.field_2._8_8_ = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
  (this->TestResult).ExecutionTime.__r = (rep_conflict)msg.field_2._8_8_;
  (this->TestResult).CompressOutput = false;
  (this->TestResult).ReturnValue = -1;
  (this->TestResult).TestCount = this->TestProperties->Index;
  std::__cxx11::string::operator=((string *)&this->TestResult,(string *)this->TestProperties);
  std::__cxx11::string::operator=
            ((string *)&(this->TestResult).Path,(string *)&this->TestProperties->Directory);
  if ((this->TestProperties->Disabled & 1U) == 0) {
    std::__cxx11::string::operator=
              ((string *)&(this->TestResult).CompletionStatus,"Failed to start");
    (this->TestResult).Status = 8;
    bVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->FailedDependencies);
    if (bVar2) {
      ComputeArguments(this);
      msg_1.field_2._8_8_ = &this->TestProperties->Args;
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)msg_1.field_2._8_8_);
      if (1 < sVar7) {
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)msg_1.field_2._8_8_,1);
        bVar2 = std::operator==(pvVar8,"NOT_AVAILABLE");
        if (bVar2) {
          std::__cxx11::string::string(local_600);
          cmCTest::GetConfigType_abi_cxx11_(this->CTest);
          uVar9 = std::__cxx11::string::empty();
          if ((uVar9 & 1) == 0) {
            cmAlphaNum::cmAlphaNum(&local_650,"Test not available in configuration \"");
            str = cmCTest::GetConfigType_abi_cxx11_(this->CTest);
            cmAlphaNum::cmAlphaNum(&local_680,str);
            cmStrCat<char[3]>(&local_620,&local_650,&local_680,(char (*) [3])0xded001);
            std::__cxx11::string::operator=(local_600,(string *)&local_620);
            std::__cxx11::string::~string((string *)&local_620);
          }
          else {
            std::__cxx11::string::operator=
                      (local_600,
                       "Test not available without configuration.  (Missing \"-C <config>\"?)");
          }
          poVar5 = std::operator<<(this->TestHandler->LogFile,local_600);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7f8);
          poVar5 = std::operator<<((ostream *)local_7f8,local_600);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          pcVar1 = this->CTest;
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                       ,0x248,pcVar6,false);
          std::__cxx11::string::~string((string *)&__range1);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7f8);
          std::__cxx11::string::operator=((string *)&(this->TestResult).Output,local_600);
          std::__cxx11::string::clear();
          std::__cxx11::string::clear();
          std::__cxx11::string::operator=
                    ((string *)&(this->TestResult).CompletionStatus,"Missing Configuration");
          (this->TestResult).Status = 0;
          std::__cxx11::string::~string(local_600);
          return false;
        }
      }
      this_00 = &this->TestProperties->RequiredFiles;
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this_00);
      file = (string *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(this_00);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&file), bVar2) {
        filename = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end1);
        bVar2 = cmsys::SystemTools::FileExists(filename);
        if (!bVar2) {
          poVar5 = std::operator<<(this->TestHandler->LogFile,"Unable to find required file: ");
          poVar5 = std::operator<<(poVar5,(string *)filename);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::ostringstream(local_9b0);
          poVar5 = std::operator<<((ostream *)local_9b0,"Unable to find required file: ");
          poVar5 = std::operator<<(poVar5,(string *)filename);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          pcVar1 = this->CTest;
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                       ,600,pcVar6,false);
          std::__cxx11::string::~string(local_9d0);
          std::__cxx11::ostringstream::~ostringstream(local_9b0);
          std::operator+(&local_9f0,"Unable to find required file: ",filename);
          std::__cxx11::string::operator=((string *)&(this->TestResult).Output,(string *)&local_9f0)
          ;
          std::__cxx11::string::~string((string *)&local_9f0);
          std::__cxx11::string::clear();
          std::__cxx11::string::clear();
          std::__cxx11::string::operator=
                    ((string *)&(this->TestResult).CompletionStatus,"Required Files Missing");
          (this->TestResult).Status = 0;
          return false;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      uVar9 = std::__cxx11::string::empty();
      if ((uVar9 & 1) == 0) {
        cmCTest::CurrentTime_abi_cxx11_((string *)&timeout,this->CTest);
        std::__cxx11::string::operator=((string *)&this->StartTime,(string *)&timeout);
        std::__cxx11::string::~string((string *)&timeout);
        stop_time.__d.__r = (duration)(this->TestProperties->Timeout).__r;
        this->TimeoutIsForStopTime = false;
        local_bd8.__d.__r = (duration)cmCTest::GetStopTime(this->CTest);
        std::chrono::
        time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)&stop_timeout);
        bVar2 = std::chrono::operator!=
                          (&local_bd8,
                           (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)&stop_timeout);
        if (bVar2) {
          local_c00.__d.__r = (duration)std::chrono::_V2::system_clock::now();
          local_bf8.__r = (rep)std::chrono::operator-(&local_bd8,&local_c00);
          local_c0c = 0x18;
          std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>
                    ((duration<long,std::ratio<3600l,1l>> *)&local_c08,&local_c0c);
          local_bf0.__r = (rep)std::chrono::operator%(&local_bf8,&local_c08);
          std::chrono::duration<double,std::ratio<1l,1l>>::
          duration<long,std::ratio<1l,1000000000l>,void>
                    ((duration<double,std::ratio<1l,1l>> *)&local_be8,&local_bf0);
          local_c18 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
          bVar2 = std::chrono::operator<=(&local_be8,&local_c18);
          if (bVar2) {
            local_c20 = (rep_conflict)std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
            local_be8 = (duration<double,_std::ratio<1L,_1L>_>)local_c20;
          }
          local_c28 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
          bVar2 = std::chrono::operator==
                            ((duration<double,_std::ratio<1L,_1L>_> *)&stop_time,&local_c28);
          local_d29 = true;
          if (!bVar2) {
            local_d29 = std::chrono::operator<
                                  (&local_be8,(duration<double,_std::ratio<1L,_1L>_> *)&stop_time);
          }
          if (local_d29 != false) {
            this->TimeoutIsForStopTime = true;
            stop_time.__d.__r = (duration)(duration)local_be8.__r;
          }
        }
        this_local._7_1_ =
             ForkProcess(this,(cmDuration)stop_time.__d.__r,
                         (bool)(this->TestProperties->ExplicitTimeout & 1),
                         &this->TestProperties->Environment,
                         &this->TestProperties->EnvironmentModification,
                         &this->TestProperties->Affinity);
      }
      else {
        poVar5 = std::operator<<(this->TestHandler->LogFile,"Unable to find executable: ");
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)msg_1.field_2._8_8_,1);
        poVar5 = std::operator<<(poVar5,(string *)pvVar8);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::ostringstream(local_b68);
        poVar5 = std::operator<<((ostream *)local_b68,"Unable to find executable: ");
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)msg_1.field_2._8_8_,1);
        poVar5 = std::operator<<(poVar5,(string *)pvVar8);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x268,pcVar6,false);
        std::__cxx11::string::~string(local_b88);
        std::__cxx11::ostringstream::~ostringstream(local_b68);
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)msg_1.field_2._8_8_,1);
        std::operator+(&local_ba8,"Unable to find executable: ",pvVar8);
        std::__cxx11::string::operator=((string *)&(this->TestResult).Output,(string *)&local_ba8);
        std::__cxx11::string::~string((string *)&local_ba8);
        std::__cxx11::string::clear();
        std::__cxx11::string::clear();
        std::__cxx11::string::operator=
                  ((string *)&(this->TestResult).CompletionStatus,"Unable to find executable");
        (this->TestResult).Status = 0;
        this_local._7_1_ = false;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_3f8,"Failed test dependencies:",(allocator<char> *)((long)&__range2 + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
      __end2 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->FailedDependencies);
      failedDep = (string *)
                  std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(&this->FailedDependencies);
      while (bVar2 = std::operator!=(&__end2,(_Self *)&failedDep), bVar2) {
        local_420 = std::
                    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(&__end2);
        std::operator+(&local_440," ",local_420);
        std::__cxx11::string::operator+=(local_3f8,(string *)&local_440);
        std::__cxx11::string::~string((string *)&local_440);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end2);
      }
      poVar5 = std::operator<<(this->TestHandler->LogFile,local_3f8);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
      poVar5 = std::operator<<((ostream *)local_5b8,local_3f8);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x233,pcVar6,false);
      std::__cxx11::string::~string((string *)&args);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
      std::__cxx11::string::operator=((string *)&(this->TestResult).Output,local_3f8);
      std::__cxx11::string::clear();
      std::__cxx11::string::clear();
      std::__cxx11::string::operator=
                ((string *)&(this->TestResult).CompletionStatus,"Fixture dependency failed");
      (this->TestResult).Status = 0;
      this_local._7_1_ = false;
      std::__cxx11::string::~string(local_3f8);
    }
  }
  else {
    std::__cxx11::string::operator=((string *)&(this->TestResult).CompletionStatus,"Disabled");
    (this->TestResult).Status = 0;
    std::__cxx11::string::operator=((string *)&(this->TestResult).Output,"Disabled");
    std::__cxx11::string::clear();
    std::__cxx11::string::clear();
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestRunTest::StartTest(size_t completed, size_t total)
{
  this->TotalNumberOfTests = total; // save for rerun case
  if (!this->CTest->GetTestProgressOutput()) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               std::setw(2 * getNumWidth(total) + 8)
                 << "Start "
                 << std::setw(getNumWidth(this->TestHandler->GetMaxIndex()))
                 << this->TestProperties->Index << ": "
                 << this->TestProperties->Name << std::endl);
  } else {
    std::string testName = this->GetTestPrefix(completed, total) +
      this->TestProperties->Name + "\n";
    cmCTestLog(this->CTest, HANDLER_TEST_PROGRESS_OUTPUT, testName);
  }

  this->ProcessOutput.clear();

  this->TestResult.Properties = this->TestProperties;
  this->TestResult.ExecutionTime = cmDuration::zero();
  this->TestResult.CompressOutput = false;
  this->TestResult.ReturnValue = -1;
  this->TestResult.TestCount = this->TestProperties->Index;
  this->TestResult.Name = this->TestProperties->Name;
  this->TestResult.Path = this->TestProperties->Directory;

  // Return immediately if test is disabled
  if (this->TestProperties->Disabled) {
    this->TestResult.CompletionStatus = "Disabled";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    this->TestResult.Output = "Disabled";
    this->TestResult.FullCommandLine.clear();
    this->TestResult.Environment.clear();
    return false;
  }

  this->TestResult.CompletionStatus = "Failed to start";
  this->TestResult.Status = cmCTestTestHandler::BAD_COMMAND;

  // Check for failed fixture dependencies before we even look at the command
  // arguments because if we are not going to run the test, the command and
  // its arguments are irrelevant. This matters for the case where a fixture
  // dependency might be creating the executable we want to run.
  if (!this->FailedDependencies.empty()) {
    std::string msg = "Failed test dependencies:";
    for (std::string const& failedDep : this->FailedDependencies) {
      msg += " " + failedDep;
    }
    *this->TestHandler->LogFile << msg << std::endl;
    cmCTestLog(this->CTest, HANDLER_OUTPUT, msg << std::endl);
    this->TestResult.Output = msg;
    this->TestResult.FullCommandLine.clear();
    this->TestResult.Environment.clear();
    this->TestResult.CompletionStatus = "Fixture dependency failed";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }

  this->ComputeArguments();
  std::vector<std::string>& args = this->TestProperties->Args;
  if (args.size() >= 2 && args[1] == "NOT_AVAILABLE") {
    std::string msg;
    if (this->CTest->GetConfigType().empty()) {
      msg = "Test not available without configuration.  (Missing \"-C "
            "<config>\"?)";
    } else {
      msg = cmStrCat("Test not available in configuration \"",
                     this->CTest->GetConfigType(), "\".");
    }
    *this->TestHandler->LogFile << msg << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE, msg << std::endl);
    this->TestResult.Output = msg;
    this->TestResult.FullCommandLine.clear();
    this->TestResult.Environment.clear();
    this->TestResult.CompletionStatus = "Missing Configuration";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }

  // Check if all required files exist
  for (std::string const& file : this->TestProperties->RequiredFiles) {
    if (!cmSystemTools::FileExists(file)) {
      // Required file was not found
      *this->TestHandler->LogFile << "Unable to find required file: " << file
                                  << std::endl;
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Unable to find required file: " << file << std::endl);
      this->TestResult.Output = "Unable to find required file: " + file;
      this->TestResult.FullCommandLine.clear();
      this->TestResult.Environment.clear();
      this->TestResult.CompletionStatus = "Required Files Missing";
      this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
      return false;
    }
  }
  // log and return if we did not find the executable
  if (this->ActualCommand.empty()) {
    // if the command was not found create a TestResult object
    // that has that information
    *this->TestHandler->LogFile << "Unable to find executable: " << args[1]
                                << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Unable to find executable: " << args[1] << std::endl);
    this->TestResult.Output = "Unable to find executable: " + args[1];
    this->TestResult.FullCommandLine.clear();
    this->TestResult.Environment.clear();
    this->TestResult.CompletionStatus = "Unable to find executable";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }
  this->StartTime = this->CTest->CurrentTime();

  auto timeout = this->TestProperties->Timeout;

  this->TimeoutIsForStopTime = false;
  std::chrono::system_clock::time_point stop_time = this->CTest->GetStopTime();
  if (stop_time != std::chrono::system_clock::time_point()) {
    std::chrono::duration<double> stop_timeout =
      (stop_time - std::chrono::system_clock::now()) % std::chrono::hours(24);

    if (stop_timeout <= std::chrono::duration<double>::zero()) {
      stop_timeout = std::chrono::duration<double>::zero();
    }
    if (timeout == std::chrono::duration<double>::zero() ||
        stop_timeout < timeout) {
      this->TimeoutIsForStopTime = true;
      timeout = stop_timeout;
    }
  }

  return this->ForkProcess(timeout, this->TestProperties->ExplicitTimeout,
                           &this->TestProperties->Environment,
                           &this->TestProperties->EnvironmentModification,
                           &this->TestProperties->Affinity);
}